

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

bool google::protobuf::compiler::java::HasRepeatedFields(Descriptor *descriptor)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar2 = (ulong)descriptor->field_count_;
  if ((long)uVar2 < 1) {
    bVar5 = false;
  }
  else {
    pbVar3 = &descriptor->fields_->field_0x1;
    bVar5 = true;
    uVar4 = 1;
    do {
      bVar1 = *pbVar3;
      if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
        HasRepeatedFields();
      }
      if ((bVar1 & 0x20) != 0) {
        return bVar5;
      }
      bVar5 = uVar4 < uVar2;
      pbVar3 = pbVar3 + 0x58;
      bVar6 = uVar4 != uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar6);
  }
  return bVar5;
}

Assistant:

bool HasRepeatedFields(const Descriptor* descriptor) {
  for (int i = 0; i < descriptor->field_count(); ++i) {
    const FieldDescriptor* field = descriptor->field(i);
    if (field->is_repeated()) {
      return true;
    }
  }
  return false;
}